

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O3

stTimeout_t * AllocTimeout(int iSize)

{
  stTimeout_t *psVar1;
  stTimeoutItemLink_t *psVar2;
  timeval now;
  timeval local_28;
  
  psVar1 = (stTimeout_t *)calloc(1,0x20);
  psVar1->iItemSize = iSize;
  psVar2 = (stTimeoutItemLink_t *)calloc(1,(long)iSize << 4);
  psVar1->pItems = psVar2;
  local_28.tv_sec = 0;
  local_28.tv_usec = 0;
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  psVar1->ullStart = local_28.tv_usec / 1000 + local_28.tv_sec * 1000;
  return psVar1;
}

Assistant:

stTimeout_t *AllocTimeout( int iSize )
{
	stTimeout_t *lp = (stTimeout_t*)calloc( 1,sizeof(stTimeout_t) );	

	lp->iItemSize = iSize;
	lp->pItems = (stTimeoutItemLink_t*)calloc( 1,sizeof(stTimeoutItemLink_t) * lp->iItemSize );

	lp->ullStart = GetTickMS();
	lp->llStartIdx = 0;

	return lp;
}